

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O0

void __thiscall
LASreadItemCompressed_WAVEPACKET13_v1::~LASreadItemCompressed_WAVEPACKET13_v1
          (LASreadItemCompressed_WAVEPACKET13_v1 *this)

{
  IntegerCompressor *pIVar1;
  LASreadItemCompressed_WAVEPACKET13_v1 *this_local;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_001aff88;
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_packet_index);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_offset_diff[0]);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_offset_diff[1]);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_offset_diff[2]);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_offset_diff[3]);
  pIVar1 = this->ic_offset_diff;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_packet_size;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_return_point;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_xyz;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  if (this->last_item != (U8 *)0x0) {
    operator_delete__(this->last_item);
  }
  LASreadItemCompressed::~LASreadItemCompressed(&this->super_LASreadItemCompressed);
  return;
}

Assistant:

LASreadItemCompressed_WAVEPACKET13_v1::~LASreadItemCompressed_WAVEPACKET13_v1()
{
  dec->destroySymbolModel(m_packet_index);
  dec->destroySymbolModel(m_offset_diff[0]);
  dec->destroySymbolModel(m_offset_diff[1]);
  dec->destroySymbolModel(m_offset_diff[2]);
  dec->destroySymbolModel(m_offset_diff[3]);
  delete ic_offset_diff;
  delete ic_packet_size;
  delete ic_return_point;
  delete ic_xyz;
  delete [] last_item;
}